

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

void __thiscall Samba::readXmodem(Samba *this,uint8_t *buffer,int size)

{
  int iVar1;
  undefined8 *puVar2;
  size_t __n;
  int iVar3;
  SerialPort *pSVar4;
  int iVar5;
  bool bVar6;
  uint8_t *local_c0;
  uint8_t blk [133];
  
  iVar5 = 1;
  local_c0 = buffer;
LAB_0010ab86:
  if (size < 1) {
    iVar5 = 5;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      iVar3 = (*((this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
      pSVar4 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      if (iVar3 == 4) {
        (*pSVar4->_vptr_SerialPort[8])(pSVar4,6);
        return;
      }
      (*pSVar4->_vptr_SerialPort[8])(pSVar4,0x15);
    }
LAB_0010ac87:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_001175a0;
    __cxa_throw(puVar2,&SambaError::typeinfo,std::exception::~exception);
  }
  iVar3 = 5;
LAB_0010ab95:
  bVar6 = iVar3 == 0;
  iVar3 = iVar3 + -1;
  if (bVar6) goto LAB_0010ac87;
  if (iVar5 == 1) {
    pSVar4 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar4->_vptr_SerialPort[8])(pSVar4,0x43);
  }
  pSVar4 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar1 = (*pSVar4->_vptr_SerialPort[5])(pSVar4,blk,0x85);
  if (((iVar1 == 0x85) && (blk[0] == '\x01')) && (blk[1] == (uint8_t)iVar5)) {
    bVar6 = crc16Check((Samba *)pSVar4,blk);
    if (bVar6) goto LAB_0010abf9;
  }
  if (iVar5 != 1) {
    pSVar4 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar4->_vptr_SerialPort[8])(pSVar4,0x15);
  }
  goto LAB_0010ab95;
LAB_0010abf9:
  pSVar4 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar4->_vptr_SerialPort[8])(pSVar4,6);
  __n = 0x80;
  if (size < 0x80) {
    __n = (size_t)(uint)size;
  }
  memcpy(local_c0,blk + 3,__n);
  local_c0 = local_c0 + 0x80;
  size = size - 0x80;
  iVar5 = iVar5 + 1;
  goto LAB_0010ab86;
}

Assistant:

void
Samba::readXmodem(uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    while (size > 0)
    {
        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            if (blkNum == 1)
                _port->put(START);

            bytes = _port->read(blk, sizeof(blk));
            if (bytes == sizeof(blk) &&
                blk[0] == SOH &&
                blk[1] == (blkNum & 0xff) &&
                crc16Check(blk))
                break;

            if (blkNum != 1)
                _port->put(NAK);
        }
        if (retries == MAX_RETRIES)
            throw SambaError();

        _port->put(ACK);

        memmove(buffer, &blk[3], min(size, BLK_SIZE));
        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == EOT)
        {
            _port->put(ACK);
            break;
        }
        _port->put(NAK);
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}